

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::TemporaryDirectoryHandle::~TemporaryDirectoryHandle(TemporaryDirectoryHandle *this)

{
  string *a;
  _Head_base<0UL,_duckdb::TemporaryFileManager_*,_false> _Var1;
  pointer pcVar2;
  string *psVar3;
  FileSystem *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  string *b;
  bool deleted_everything;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  files_to_delete;
  char local_79;
  string *local_78;
  string *psStack_70;
  undefined8 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  _Var1._M_head_impl =
       (this->temp_file).
       super_unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TemporaryFileManager_*,_std::default_delete<duckdb::TemporaryFileManager>_>
       .super__Head_base<0UL,_duckdb::TemporaryFileManager_*,_false>._M_head_impl;
  (this->temp_file).
  super_unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TemporaryFileManager_*,_std::default_delete<duckdb::TemporaryFileManager>_>
  .super__Head_base<0UL,_duckdb::TemporaryFileManager_*,_false>._M_head_impl =
       (TemporaryFileManager *)0x0;
  if (_Var1._M_head_impl != (TemporaryFileManager *)0x0) {
    TemporaryFileManager::~TemporaryFileManager(_Var1._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  this_00 = FileSystem::GetFileSystem(this->db);
  if ((this->temp_directory)._M_string_length != 0) {
    a = &this->temp_directory;
    local_78 = (string *)0x0;
    psStack_70 = (string *)0x0;
    local_68 = 0;
    if (this->created_directory == false) {
      local_58._0_8_ = &local_79;
      local_79 = '\x01';
      local_58._8_8_ = &local_78;
      local_48._8_8_ =
           ::std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/temporary_file_manager.cpp:670:33)>
           ::_M_invoke;
      local_48._0_8_ =
           ::std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/temporary_file_manager.cpp:670:33)>
           ::_M_manager;
      (*this_00->_vptr_FileSystem[0x10])(this_00,a,local_58,0);
      if ((code *)local_48._0_8_ != (code *)0x0) {
        (*(code *)local_48._0_8_)(local_58,local_58,3);
      }
      psVar3 = psStack_70;
      if (local_78 != psStack_70) {
        b = local_78;
        do {
          FileSystem::JoinPath((string *)local_58,this_00,a,b);
          (*this_00->_vptr_FileSystem[0x14])(this_00,(string *)local_58,0);
          if ((undefined1 *)local_58._0_8_ != local_48) {
            operator_delete((void *)local_58._0_8_);
          }
          b = b + 1;
        } while (b != psVar3);
      }
    }
    else {
      local_68 = 0;
      psStack_70 = (string *)0x0;
      local_78 = (string *)0x0;
      (*this_00->_vptr_FileSystem[0xf])(this_00,a,0);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_78);
  }
  _Var1._M_head_impl =
       (this->temp_file).
       super_unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TemporaryFileManager_*,_std::default_delete<duckdb::TemporaryFileManager>_>
       .super__Head_base<0UL,_duckdb::TemporaryFileManager_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (TemporaryFileManager *)0x0) {
    TemporaryFileManager::~TemporaryFileManager(_Var1._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  (this->temp_file).
  super_unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TemporaryFileManager_*,_std::default_delete<duckdb::TemporaryFileManager>_>
  .super__Head_base<0UL,_duckdb::TemporaryFileManager_*,_false>._M_head_impl =
       (TemporaryFileManager *)0x0;
  pcVar2 = (this->temp_directory)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->temp_directory).field_2) {
    operator_delete(pcVar2);
  }
  return;
}

Assistant:

TemporaryDirectoryHandle::~TemporaryDirectoryHandle() {
	// first release any temporary files
	temp_file.reset();
	// then delete the temporary file directory
	auto &fs = FileSystem::GetFileSystem(db);
	if (!temp_directory.empty()) {
		bool delete_directory = created_directory;
		vector<string> files_to_delete;
		if (!created_directory) {
			bool deleted_everything = true;
			fs.ListFiles(temp_directory, [&](const string &path, bool isdir) {
				if (isdir) {
					deleted_everything = false;
					return;
				}
				if (!StringUtil::StartsWith(path, "duckdb_temp_")) {
					deleted_everything = false;
					return;
				}
				files_to_delete.push_back(path);
			});
		}
		if (delete_directory) {
			// we want to remove all files in the directory
			fs.RemoveDirectory(temp_directory);
		} else {
			for (auto &file : files_to_delete) {
				fs.RemoveFile(fs.JoinPath(temp_directory, file));
			}
		}
	}
}